

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_complex_sqrt(sexp ctx,sexp z)

{
  sexp psVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_40;
  double local_38;
  sexp_gc_var_t local_28;
  
  dVar2 = sexp_to_double(ctx,(z->value).type.name);
  local_38 = sexp_to_double(ctx,(z->value).type.cpl);
  local_28.var = &local_40;
  local_40 = (sexp)0x43e;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  dVar3 = dVar2 * dVar2 + local_38 * local_38;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  local_40 = sexp_make_complex(ctx,(sexp)&DAT_00000001,(sexp)&DAT_00000001);
  dVar4 = (dVar2 + dVar3) * 0.5;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  psVar1 = sexp_make_flonum(ctx,dVar4);
  dVar2 = (dVar3 - dVar2) * 0.5;
  (local_40->value).type.name = psVar1;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  psVar1 = sexp_make_flonum(ctx,(double)(~-(ulong)(local_38 < 0.0) & (ulong)dVar2 |
                                        (ulong)-dVar2 & -(ulong)(local_38 < 0.0)));
  (local_40->value).type.cpl = psVar1;
  (ctx->value).context.saves = local_28.next;
  return local_40;
}

Assistant:

sexp sexp_complex_sqrt (sexp ctx, sexp z) {
  double x = sexp_to_double(ctx, sexp_complex_real(z)),
    y = sexp_to_double(ctx, sexp_complex_imag(z)), r;
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  r = sqrt(x*x + y*y);
  res = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
  sexp_complex_real(res) = sexp_make_flonum(ctx, sqrt((x+r)/2));
  sexp_complex_imag(res) = sexp_make_flonum(ctx, ((y<-0.0)?-1:1)*sqrt((-x+r)/2));
  sexp_gc_release1(ctx);
  return res;
}